

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_capa(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  pop3_conn *pop3c;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  *(undefined2 *)((long)&conn->proto + 0xd0) = 0;
  *(undefined2 *)((long)&conn->proto + 0xd4) = 0;
  *(byte *)((long)&conn->proto + 0xe2) = *(byte *)((long)&conn->proto + 0xe2) & 0xfd;
  CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s","CAPA");
  if (CVar1 == CURLE_OK) {
    pop3_state(data,POP3_CAPA);
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_perform_capa(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  pop3c->sasl.authmechs = SASL_AUTH_NONE; /* No known auth. mechanisms yet */
  pop3c->sasl.authused = SASL_AUTH_NONE;  /* Clear the auth. mechanism used */
  pop3c->tls_supported = FALSE;           /* Clear the TLS capability */

  /* Send the CAPA command */
  result = Curl_pp_sendf(data, &pop3c->pp, "%s", "CAPA");

  if(!result)
    pop3_state(data, POP3_CAPA);

  return result;
}